

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

int coda_random_init(void)

{
  ssize_t sVar1;
  int rc;
  uint32_t rnd_from_device;
  int fd;
  uint local_c;
  int local_8;
  int local_4;
  
  if (coda_random_inited == 0) {
    local_8 = open64("/dev/urandom",0);
    if (local_8 < 0) {
      local_4 = -1;
    }
    else {
      sVar1 = read(local_8,&local_c,4);
      if ((int)sVar1 < 0) {
        local_4 = -1;
      }
      else {
        close(local_8);
        srandom(local_c);
        coda_random_inited = 1;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int coda_random_init()
{
	if (coda_random_inited)
	{
		return 0;
	}

	int fd = open("/dev/urandom", O_RDONLY);
	if (0 > fd) return -1;

	uint32_t rnd_from_device;

	int rc = read(fd, &rnd_from_device, sizeof(rnd_from_device));
	if (0 > rc) return -1;

	close(fd);

	srandom(rnd_from_device);
	coda_random_inited = 1;

	return 0;
}